

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O2

string * __thiscall
embree::BVHNStatistics<4>::Statistics::LeafStat::histToString_abi_cxx11_
          (string *__return_storage_ptr__,LeafStat *this)

{
  ostream *poVar1;
  size_t i;
  long lVar2;
  ostringstream stream;
  long local_1a8;
  undefined8 local_1a0 [2];
  uint auStack_190 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 6;
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 2;
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (&local_1a8,
                        ((float)this->numPrimBlocksHistogram[lVar2] * 100.0) /
                        (float)this->numLeaves);
    std::operator<<(poVar1,"% ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string histToString() const
        {
          std::ostringstream stream;
          stream.setf(std::ios::fixed, std::ios::floatfield);
          for (size_t i=0; i<NHIST; i++)
            stream << std::setw(6) << std::setprecision(2) << 100.0f*float(numPrimBlocksHistogram[i])/float(numLeaves) << "% ";
          return stream.str();
        }